

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpu_data.h
# Opt level: O3

void * dlib::memcpy(void *__dest,void *__src,size_t __n)

{
  uint *puVar1;
  void *pvVar2;
  ostream *poVar3;
  fatal_error *pfVar4;
  void *in_RCX;
  void *pvVar5;
  void *in_R8;
  void *pvVar6;
  ostringstream dlib_o_out;
  string local_1b0;
  long local_190 [3];
  uint auStack_178 [88];
  
  pvVar2 = *__dest;
  if (pvVar2 < (void *)((long)in_R8 + (long)__src)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"\n\nError detected at line ",0x19);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xee);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/cuda/gpu_data.h"
               ,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "void dlib::memcpy(gpu_data &, size_t, const gpu_data &, size_t, size_t)",0x47);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"dest_offset + num <= dest.size()",0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
    puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
    *puVar1 = *puVar1 | 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&local_1b0);
    __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
  }
  if ((ulong)((long)in_R8 + (long)in_RCX) <= *(ulong *)__n) {
    if (in_R8 == (void *)0x0) {
      return pvVar2;
    }
    if (__dest == (void *)__n) {
      pvVar6 = in_RCX;
      pvVar5 = __src;
      if (in_RCX < __src) {
        pvVar6 = __src;
        pvVar5 = in_RCX;
      }
      if (pvVar6 < (void *)((long)pvVar5 + (long)in_R8)) {
        if (__src == in_RCX) {
          return pvVar2;
        }
        *(undefined1 *)((long)__dest + 9) = 0;
        pvVar2 = memmove((void *)((long)__src * 4 + *(long *)((long)__dest + 0x10)),
                         (void *)((long)in_RCX * 4 + *(long *)(__n + 0x10)),(long)in_R8 << 2);
        return pvVar2;
      }
    }
    if (pvVar2 == in_R8 && __src == (void *)0x0) {
      *(undefined2 *)((long)__dest + 8) = 1;
      pvVar2 = *(void **)((long)__dest + 0x10);
      pvVar5 = (void *)((long)in_RCX * 4 + *(long *)(__n + 0x10));
    }
    else {
      *(undefined1 *)((long)__dest + 9) = 0;
      pvVar2 = (void *)((long)__src * 4 + *(long *)((long)__dest + 0x10));
      pvVar5 = (void *)((long)in_RCX * 4 + *(long *)(__n + 0x10));
    }
    pvVar2 = ::memcpy(pvVar2,pvVar5,(long)in_R8 << 2);
    return pvVar2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\n\nError detected at line ",0x19);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xef);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/cuda/gpu_data.h"
             ,0x7d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "void dlib::memcpy(gpu_data &, size_t, const gpu_data &, size_t, size_t)",0x47);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"src_offset + num <= src.size()",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,".\n",2);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"",0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  pfVar4 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(pfVar4,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(pfVar4,&fatal_error::typeinfo,error::~error);
}

Assistant:

inline void memcpy (
        gpu_data& dest, 
        size_t dest_offset,
        const gpu_data& src,
        size_t src_offset,
        size_t num
    )
    {
        DLIB_CASSERT(dest_offset + num <= dest.size());
        DLIB_CASSERT(src_offset + num <= src.size());
        if (num == 0)
            return;
        if (&dest == &src && std::max(dest_offset, src_offset) < std::min(dest_offset,src_offset)+num)
        {
            // if they perfectly alias each other then there is nothing to do
            if (dest_offset == src_offset)
                return;
            else
                std::memmove(dest.host()+dest_offset, src.host()+src_offset, sizeof(float)*num);
        }
        else
        {
            // if we write to the entire thing then we can use host_write_only()
            if (dest_offset == 0 && num == dest.size())
                std::memcpy(dest.host_write_only(), src.host()+src_offset, sizeof(float)*num);
            else
                std::memcpy(dest.host()+dest_offset, src.host()+src_offset, sizeof(float)*num);
        }
    }